

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O3

void SituationToFen(Situation *situation,char *fen)

{
  long lVar1;
  byte bVar2;
  UINT8 *pUVar3;
  char cVar4;
  long lVar5;
  char *pcVar6;
  char *fent;
  long lVar7;
  long lVar8;
  char *pcVar9;
  
  pUVar3 = situation->current_board + 0x30;
  lVar5 = 3;
  do {
    pcVar6 = fen;
    lVar8 = 3;
    do {
      lVar7 = 0;
      while( true ) {
        bVar2 = pUVar3[lVar7 + lVar8];
        if (bVar2 != 0) break;
        lVar1 = lVar8 + lVar7;
        lVar7 = lVar7 + 1;
        if (lVar1 == 0xb) {
          *pcVar6 = (char)lVar7 + '0';
          pcVar6 = pcVar6 + 1;
          goto LAB_00108a39;
        }
      }
      if ((int)lVar7 != 0) {
        *pcVar6 = (char)lVar7 + '0';
        pcVar6 = pcVar6 + 1;
      }
      pcVar9 = "vector::_M_realloc_insert" + (ulong)bVar2 + 0xb;
      if ((bVar2 & 0x10) != 0) {
        pcVar9 = FEN_OF_PIECE[0] + (bVar2 - 0x10);
      }
      *pcVar6 = *pcVar9;
      pcVar6 = pcVar6 + 1;
      lVar1 = lVar8 + lVar7;
      lVar8 = lVar8 + lVar7 + 1;
    } while (lVar1 != 0xb);
LAB_00108a39:
    *pcVar6 = '/';
    lVar5 = lVar5 + 1;
    pUVar3 = pUVar3 + 0x10;
    fen = pcVar6 + 1;
    if (lVar5 == 0xd) {
      *pcVar6 = ' ';
      cVar4 = 'b';
      if (situation->current_player == 0) {
        cVar4 = 'w';
      }
      pcVar6[1] = cVar4;
      pcVar6[2] = '\0';
      return;
    }
  } while( true );
}

Assistant:

void SituationToFen(Situation & situation, char* fen){
    int row, col, piece_id, space_count;
    char *fent = fen;
    for(row = 3; row <= 12; row++){
        space_count = 0;
        for(col = 3; col <= 11; col ++){
            piece_id = situation.current_board[GetPosition(col, row)];
            if(piece_id != 0){
                if(space_count != 0){
                    *fent = space_count + '0';
                    space_count = 0;
                    fent ++;
                }
                if(piece_id & 16){
                    *fent = FEN_OF_PIECE[0][piece_id - 16];
                }
                else{
                    *fent = FEN_OF_PIECE[1][piece_id - 32];
                }
                fent ++;
            }
            else{
                space_count ++;
            }
        }
        if(space_count > 0){
            *fent = space_count + '0';
            fent ++;
        }
        *fent = '/';
        fent ++;
    }
    *(fent - 1) = ' ';
    *fent = (situation.current_player == RED ? 'w' : 'b');
    fent ++;
    *fent = '\0';
}